

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qconcatenatetablesproxymodel.cpp
# Opt level: O1

void __thiscall
QConcatenateTablesProxyModelPrivate::slotColumnsInserted
          (QConcatenateTablesProxyModelPrivate *this,QModelIndex *parent,int start,int end)

{
  QObject *this_00;
  
  this_00 = (this->super_QAbstractItemModelPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  if ((((parent->r < 0) || (parent->c < 0)) || ((parent->m).ptr == (QAbstractItemModel *)0x0)) &&
     (this->m_newColumnCount != this->m_columnCount)) {
    this->m_columnCount = this->m_newColumnCount;
    QAbstractItemModel::endInsertColumns((QAbstractItemModel *)this_00);
    return;
  }
  return;
}

Assistant:

void QConcatenateTablesProxyModelPrivate::slotColumnsInserted(const QModelIndex &parent, int start,
                                                              int end)
{
    Q_UNUSED(start);
    Q_UNUSED(end);
    Q_Q(QConcatenateTablesProxyModel);
    if (parent.isValid()) // flat model
        return;
    if (m_newColumnCount != m_columnCount) {
        m_columnCount = m_newColumnCount;
        q->endInsertColumns();
    }
}